

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::verifyReadBuffer
          (FunctionalTest13 *this,uint n_fs_id,uint n_fs_subroutine,uint n_gs_id,
          uint n_gs_subroutine,uint n_tc_id,uint n_tc_subroutine,uint n_te_id,uint n_te_subroutine,
          uint n_vs_id,uint n_vs_subroutine)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  float fVar2;
  byte local_252;
  byte local_251;
  MessageBuilder local_238;
  float *local_b8;
  float *texel_ptr;
  uchar *puStack_a8;
  uint x;
  float *row_ptr;
  uint y;
  uint uStack_94;
  bool should_continue;
  float epsilon;
  uint n_component_2;
  uint n_component_1;
  uint n_component;
  float vs_modifier [4];
  float te_modifier [4];
  float tc_modifier [4];
  float gs_modifier [4];
  float fs_modifier [4];
  float expected_color [4];
  uint local_20;
  uint n_tc_id_local;
  uint n_gs_subroutine_local;
  uint n_gs_id_local;
  uint n_fs_subroutine_local;
  uint n_fs_id_local;
  FunctionalTest13 *this_local;
  
  expected_color[3] = (float)n_tc_id;
  local_20 = n_gs_subroutine;
  n_tc_id_local = n_gs_id;
  n_gs_subroutine_local = n_fs_subroutine;
  n_gs_id_local = n_fs_id;
  _n_fs_subroutine_local = this;
  memset(fs_modifier + 2,0,0x10);
  memset(gs_modifier + 2,0,0x10);
  memset(tc_modifier + 2,0,0x10);
  memset(te_modifier + 2,0,0x10);
  memset(vs_modifier + 2,0,0x10);
  memset(&n_component_1,0,0x10);
  if (n_gs_subroutine_local == 0) {
    for (n_component_2 = 0; n_component_2 < 4; n_component_2 = n_component_2 + 1) {
      gs_modifier[(ulong)n_component_2 + 2] = (float)(n_gs_id_local + 1 + n_component_2) / 10.0;
    }
  }
  else {
    for (epsilon = 0.0; (uint)epsilon < 4; epsilon = (float)((int)epsilon + 1)) {
      gs_modifier[(ulong)(uint)epsilon + 2] = (float)(n_gs_id_local + 1 + (int)epsilon) / 20.0;
    }
  }
  if (local_20 == 0) {
    gs_modifier[1] = (float)(n_tc_id_local + 1) * 0.425;
  }
  else {
    gs_modifier[1] = (float)(n_tc_id_local + 1) * 0.0425;
  }
  if (n_tc_subroutine == 0) {
    te_modifier[3] = (float)((int)expected_color[3] + 1) * 0.25;
  }
  else {
    te_modifier[3] = (float)((int)expected_color[3] + 1) * 0.025;
  }
  if (n_te_subroutine == 0) {
    te_modifier[0] = (float)(n_te_id + 1) * 0.325;
  }
  else {
    te_modifier[0] = (float)(n_te_id + 1) * 0.0325;
  }
  if (n_vs_subroutine == 0) {
    n_component_1 = (uint)((float)(n_vs_id + 1) * 0.125);
  }
  else {
    n_component_1 = (uint)((float)(n_vs_id + 1) * 0.0125);
  }
  for (uStack_94 = 0; uStack_94 < 4; uStack_94 = uStack_94 + 1) {
    fs_modifier[(ulong)uStack_94 + 2] =
         gs_modifier[(ulong)uStack_94 + 2] + tc_modifier[(ulong)uStack_94 + 2] +
         te_modifier[(ulong)uStack_94 + 2] + vs_modifier[(ulong)uStack_94 + 2] +
         (float)(&n_component_1)[uStack_94];
  }
  y = 0x3727c5ac;
  row_ptr._7_1_ = 1;
  row_ptr._0_4_ = 0;
  while( true ) {
    local_251 = 0;
    if ((uint)row_ptr < this->m_to_height) {
      local_251 = row_ptr._7_1_;
    }
    if ((local_251 & 1) == 0) break;
    puStack_a8 = this->m_read_buffer + (ulong)((uint)row_ptr * this->m_to_width * 4) * 4;
    texel_ptr._4_4_ = 0;
    while( true ) {
      local_252 = 0;
      if (texel_ptr._4_4_ < this->m_to_width) {
        local_252 = row_ptr._7_1_;
      }
      if ((local_252 & 1) == 0) break;
      local_b8 = (float *)(puStack_a8 + (ulong)(texel_ptr._4_4_ << 2) * 4);
      fVar2 = de::abs<float>(*local_b8 - fs_modifier[2]);
      if ((((1e-05 < fVar2) || (fVar2 = de::abs<float>(local_b8[1] - fs_modifier[3]), 1e-05 < fVar2)
           ) || (fVar2 = de::abs<float>(local_b8[2] - expected_color[0]), 1e-05 < fVar2)) ||
         (fVar2 = de::abs<float>(local_b8[3] - expected_color[1]), 1e-05 < fVar2)) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_238,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (&local_238,(char (*) [28])"Invalid texel rendered at (");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)((long)&texel_ptr + 4));
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)&row_ptr);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (pMVar1,(char (*) [44])") for the following configuration: n_fs_id:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&n_gs_id_local);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])" n_fs_subroutine:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&n_gs_subroutine_local);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [10])" n_gs_id:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&n_tc_id_local);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])" n_gs_subroutine:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_20);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [10])" n_tc_id:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)(expected_color + 3));
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])" n_tc_subroutine:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&n_tc_subroutine);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [10])" n_te_id:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&n_te_id);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])" n_te_subroutine:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&n_te_subroutine);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [10])" n_vs_id:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&n_vs_id);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])" n_vs_subroutine:");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&n_vs_subroutine);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [13])0x29f5d15);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,fs_modifier + 2);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,fs_modifier + 3);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,expected_color);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,expected_color + 1);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [11])"), found:(");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_b8);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_b8 + 1);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_b8 + 2);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a3caab);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_b8 + 3);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2c156ab);
        tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_238);
        this->m_has_test_passed = false;
        row_ptr._7_1_ = 0;
      }
      texel_ptr._4_4_ = texel_ptr._4_4_ + 1;
    }
    row_ptr._0_4_ = (uint)row_ptr + 1;
  }
  return;
}

Assistant:

void FunctionalTest13::verifyReadBuffer(unsigned int n_fs_id, unsigned int n_fs_subroutine, unsigned int n_gs_id,
										unsigned int n_gs_subroutine, unsigned int n_tc_id,
										unsigned int n_tc_subroutine, unsigned int n_te_id,
										unsigned int n_te_subroutine, unsigned int n_vs_id,
										unsigned int n_vs_subroutine)
{
	float expected_color[4] = { 0 };
	float fs_modifier[4]	= { 0 };
	float gs_modifier[4]	= { 0 };
	float tc_modifier[4]	= { 0 };
	float te_modifier[4]	= { 0 };
	float vs_modifier[4]	= { 0 };

	if (n_fs_subroutine == 0)
	{
		for (unsigned int n_component = 0; n_component < 4; ++n_component)
		{
			fs_modifier[n_component] = float(n_fs_id + n_component + 1) / 10.0f;
		}
	}
	else
	{
		for (unsigned int n_component = 0; n_component < 4; ++n_component)
		{
			fs_modifier[n_component] = float(n_fs_id + n_component + 1) / 20.0f;
		}
	}

	if (n_gs_subroutine == 0)
	{
		gs_modifier[3] = float(n_gs_id + 1) * 0.425f;
	}
	else
	{
		gs_modifier[3] = float(n_gs_id + 1) * 0.0425f;
	}

	if (n_tc_subroutine == 0)
	{
		tc_modifier[1] = float(n_tc_id + 1) * 0.25f;
	}
	else
	{
		tc_modifier[1] = float(n_tc_id + 1) * 0.025f;
	}

	if (n_te_subroutine == 0)
	{
		te_modifier[2] = float(n_te_id + 1) * 0.325f;
	}
	else
	{
		te_modifier[2] = float(n_te_id + 1) * 0.0325f;
	}

	if (n_vs_subroutine == 0)
	{
		vs_modifier[0] = float(n_vs_id + 1) * 0.125f;
	}
	else
	{
		vs_modifier[0] = float(n_vs_id + 1) * 0.0125f;
	}

	/* Determine the expected color */
	for (unsigned int n_component = 0; n_component < 4 /* rgba */; ++n_component)
	{
		expected_color[n_component] = fs_modifier[n_component] + gs_modifier[n_component] + tc_modifier[n_component] +
									  te_modifier[n_component] + vs_modifier[n_component];
	}

	/* Verify all read texels are valid */
	const float epsilon			= 1e-5f;
	bool		should_continue = true;

	for (unsigned int y = 0; y < m_to_height && should_continue; ++y)
	{
		const float* row_ptr = (const float*)m_read_buffer + y * m_to_width * 4; /* rgba */

		for (unsigned int x = 0; x < m_to_width && should_continue; ++x)
		{
			const float* texel_ptr = row_ptr + x * 4; /* rgba */

			if (de::abs(texel_ptr[0] - expected_color[0]) > epsilon ||
				de::abs(texel_ptr[1] - expected_color[1]) > epsilon ||
				de::abs(texel_ptr[2] - expected_color[2]) > epsilon ||
				de::abs(texel_ptr[3] - expected_color[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel rendered at (" << x << ", " << y
								   << ") for "
									  "the following configuration: "
									  "n_fs_id:"
								   << n_fs_id << " n_fs_subroutine:" << n_fs_subroutine << " n_gs_id:" << n_gs_id
								   << " n_gs_subroutine:" << n_gs_subroutine << " n_tc_id:" << n_tc_id
								   << " n_tc_subroutine:" << n_tc_subroutine << " n_te_id:" << n_te_id
								   << " n_te_subroutine:" << n_te_subroutine << " n_vs_id:" << n_vs_id
								   << " n_vs_subroutine:" << n_vs_subroutine << "; expected:"
																				"("
								   << expected_color[0] << ", " << expected_color[1] << ", " << expected_color[2]
								   << ", " << expected_color[3] << "), found:"
																   "("
								   << texel_ptr[0] << ", " << texel_ptr[1] << ", " << texel_ptr[2] << ", "
								   << texel_ptr[3] << ")." << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
				should_continue   = false;
			}
		} /* for (all columns) */
	}	 /* for (all rows) */
}